

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,unsigned_int,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,uint significand,
          int significand_size,int integral_size,char16_t decimal_point,
          digit_grouping<char16_t> *grouping)

{
  uint uVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar2;
  uint uVar3;
  int iVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  char16_t *pcVar7;
  format_decimal_result<char16_t_*> fVar8;
  basic_string_view<char16_t> digits;
  char16_t cStack_458;
  char16_t acStack_456 [15];
  undefined8 local_438;
  undefined1 *local_430;
  long lStack_428;
  long local_420;
  undefined1 local_418 [1008];
  
  if ((grouping->sep_).thousands_sep == L'\0') {
    if (decimal_point == L'\0') {
      fVar8 = format_decimal<char16_t,unsigned_int>
                        ((char16_t *)&local_438,significand,significand_size);
      pcVar5 = fVar8.end;
    }
    else {
      pcVar5 = (char16_t *)((long)&local_438 + (long)significand_size * 2 + 2);
      uVar3 = significand_size - integral_size;
      pcVar6 = pcVar5;
      if (1 < (int)uVar3) {
        iVar4 = (uVar3 >> 1) + 1;
        pcVar7 = pcVar5;
        uVar1 = significand;
        do {
          pcVar6 = pcVar7 + -2;
          significand = uVar1 / 100;
          pcVar7[-2] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [(ulong)(uVar1 % 100) * 2];
          pcVar7[-1] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [(ulong)(uVar1 % 100) * 2 + 1];
          iVar4 = iVar4 + -1;
          pcVar7 = pcVar6;
          uVar1 = uVar1 / 100;
        } while (1 < iVar4);
      }
      uVar1 = significand;
      if ((uVar3 & 1) != 0) {
        uVar1 = significand / 10;
        pcVar6[-1] = (short)significand + (short)(significand / 10) * -10 | 0x30;
        pcVar6 = pcVar6 + -1;
      }
      pcVar6[-1] = decimal_point;
      format_decimal<char16_t,unsigned_int>(pcVar6 + (-1 - (long)integral_size),uVar1,integral_size)
      ;
    }
    bVar2 = copy_str_noinline<char16_t,char16_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      ((char16_t *)&local_438,pcVar5,out);
  }
  else {
    lStack_428 = 0;
    local_438 = &PTR_grow_001b28b0;
    local_420 = 500;
    local_430 = local_418;
    if (decimal_point == L'\0') {
      fVar8 = format_decimal<char16_t,unsigned_int>(&cStack_458,significand,significand_size);
      pcVar5 = fVar8.end;
    }
    else {
      pcVar5 = acStack_456 + significand_size;
      uVar3 = significand_size - integral_size;
      pcVar6 = pcVar5;
      if (1 < (int)uVar3) {
        iVar4 = (uVar3 >> 1) + 1;
        pcVar7 = pcVar5;
        uVar1 = significand;
        do {
          pcVar6 = pcVar7 + -2;
          significand = uVar1 / 100;
          pcVar7[-2] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [(ulong)(uVar1 % 100) * 2];
          pcVar7[-1] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [(ulong)(uVar1 % 100) * 2 + 1];
          iVar4 = iVar4 + -1;
          pcVar7 = pcVar6;
          uVar1 = uVar1 / 100;
        } while (1 < iVar4);
      }
      uVar1 = significand;
      if ((uVar3 & 1) != 0) {
        uVar1 = significand / 10;
        pcVar6[-1] = (short)significand + (short)(significand / 10) * -10 | 0x30;
        pcVar6 = pcVar6 + -1;
      }
      pcVar6[-1] = decimal_point;
      format_decimal<char16_t,unsigned_int>(pcVar6 + (-1 - (long)integral_size),uVar1,integral_size)
      ;
    }
    copy_str_noinline<char16_t,char16_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
              (&cStack_458,pcVar5,(buffer<char16_t> *)&local_438);
    if (integral_size < 0) {
      fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                 ,0x195,"negative value");
    }
    digits.size_._0_4_ = integral_size;
    digits.data_ = (char16_t *)local_430;
    digits.size_._4_4_ = 0;
    digit_grouping<char16_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
              (grouping,out,digits);
    bVar2 = copy_str_noinline<char16_t,char16_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      ((char16_t *)(local_430 + (ulong)(uint)integral_size * 2),
                       (char16_t *)(local_430 + lStack_428 * 2),out);
    if (local_430 != local_418) {
      operator_delete(local_430,local_420 * 2);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}